

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

void mbedtls_mpi_swap(mbedtls_mpi *X,mbedtls_mpi *Y)

{
  mbedtls_mpi_uint *pmVar1;
  short sVar2;
  unsigned_short uVar3;
  undefined4 uVar4;
  short sVar5;
  unsigned_short uVar6;
  undefined4 uVar7;
  mbedtls_mpi T;
  
  pmVar1 = X->p;
  sVar5 = X->s;
  uVar6 = X->n;
  uVar7 = *(undefined4 *)&X->field_0xc;
  sVar2 = Y->s;
  uVar3 = Y->n;
  uVar4 = *(undefined4 *)&Y->field_0xc;
  X->p = Y->p;
  X->s = sVar2;
  X->n = uVar3;
  *(undefined4 *)&X->field_0xc = uVar4;
  Y->p = pmVar1;
  Y->s = sVar5;
  Y->n = uVar6;
  *(undefined4 *)&Y->field_0xc = uVar7;
  return;
}

Assistant:

void mbedtls_mpi_swap(mbedtls_mpi *X, mbedtls_mpi *Y)
{
    mbedtls_mpi T;
    MPI_VALIDATE(X != NULL);
    MPI_VALIDATE(Y != NULL);

    memcpy(&T,  X, sizeof(mbedtls_mpi));
    memcpy(X,  Y, sizeof(mbedtls_mpi));
    memcpy(Y, &T, sizeof(mbedtls_mpi));
}